

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  
  pbVar2 = ctxt->cur;
  while ((uVar3 = (ulong)*pbVar2, uVar3 < 0x21 && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
    ctxt->cur = pbVar2;
  }
  bVar1 = true;
  iVar4 = 0;
  do {
    if ((char)uVar3 != '-') {
      xmlXPathCompPathExpr(ctxt);
      if (ctxt->error == 0) {
        pbVar2 = ctxt->cur;
        while( true ) {
          uVar3 = (ulong)*pbVar2;
          if ((0x20 < uVar3) || ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0)) break;
          ctxt->cur = pbVar2 + 1;
          pbVar2 = pbVar2 + 1;
        }
        while ((char)uVar3 == '|') {
          ch1 = ctxt->comp->last;
          xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
          pbVar2 = ctxt->cur;
          if (*pbVar2 != 0) goto LAB_001b689e;
          while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
LAB_001b689e:
            pbVar2 = pbVar2 + 1;
            ctxt->cur = pbVar2;
          }
          xmlXPathCompPathExpr(ctxt);
          xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_UNION,0,0,0,(void *)0x0,(void *)0x0
                             );
          pbVar2 = ctxt->cur;
          while( true ) {
            uVar3 = (ulong)*pbVar2;
            if ((0x20 < uVar3) || ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0)) break;
            ctxt->cur = pbVar2 + 1;
            pbVar2 = pbVar2 + 1;
          }
        }
        if (!bVar1 && ctxt->error == 0) {
          xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_PLUS,(iVar4 == 0) + 2,0,0,
                              (void *)0x0,(void *)0x0);
        }
      }
      return;
    }
    do {
      pbVar2 = pbVar2 + 1;
      ctxt->cur = pbVar2;
      uVar3 = (ulong)*pbVar2;
      if (0x20 < uVar3) break;
    } while ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0);
    iVar4 = 1 - iVar4;
    bVar1 = false;
  } while( true );
}

Assistant:

static void
xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt) {
    int minus = 0;
    int found = 0;

    SKIP_BLANKS;
    while (CUR == '-') {
        minus = 1 - minus;
	found = 1;
	NEXT;
	SKIP_BLANKS;
    }

    xmlXPathCompUnionExpr(ctxt);
    CHECK_ERROR;
    if (found) {
	if (minus)
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 2, 0);
	else
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 3, 0);
    }
}